

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall xray_re::xr_swibuf::load(xr_swibuf *this,xr_reader *r)

{
  uint *puVar1;
  ogf4_slide_window *poVar2;
  ulong uVar3;
  
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf).m_size = 0;
  xr_reader::r_cseq<unsigned_int>(r,4,this->m_reserved);
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  uVar3 = (ulong)*puVar1;
  if (uVar3 != 0) {
    poVar2 = (ogf4_slide_window *)operator_new__(uVar3 * 8);
    this->m_slide_windows = poVar2;
    xr_reader::r_cseq<xray_re::ogf4_slide_window,read_sw>(r,uVar3,poVar2);
    return;
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_geom_buf.cxx"
                ,0x218,"void xray_re::xr_swibuf::load(xr_reader &)");
}

Assistant:

void xr_swibuf::load(xr_reader& r)
{
	xr_flexbuf::clear();
	r.r_cseq<uint32_t>(4, m_reserved);
	size_t n = r.r_u32();
	xr_assert(n > 0);
	m_slide_windows = new ogf4_slide_window[n];
	r.r_cseq(n, m_slide_windows, read_sw());
}